

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O3

bool is_unicode_string(string *v,string *str)

{
  int iVar1;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::substr((ulong)local_48,(ulong)v);
  iVar1 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (iVar1 == 0) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)v);
    std::__cxx11::string::operator=((string *)str,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return iVar1 == 0;
}

Assistant:

static bool
is_unicode_string(std::string const& v, std::string& str)
{
    if (v.substr(0, 2) == "u:") {
        str = v.substr(2);
        return true;
    }
    return false;
}